

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter1.cpp
# Opt level: O2

void __thiscall UIContext::Detail::~Detail(Detail *this)

{
  ImGui_ImplOpenGL3_Shutdown();
  ImGui_ImplGlfw_Shutdown();
  ImGui::DestroyContext((ImGuiContext *)0x0);
  glfwDestroyWindow(this->_window);
  glfwTerminate();
  std::_Function_base::~_Function_base(&(this->_run).super__Function_base);
  std::__cxx11::string::~string((string *)&this->_window_name);
  return;
}

Assistant:

~Detail()
    {
        // Cleanup
        ImGui_ImplOpenGL3_Shutdown();
        ImGui_ImplGlfw_Shutdown();
        ImGui::DestroyContext();

        glfwDestroyWindow(_window);
        glfwTerminate();
    }